

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalsList.h
# Opt level: O3

IntervalsList * __thiscall
dg::dda::IntervalsList::intersectWith(IntervalsList *this,IntervalsList *rhs)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  _Self __tmp;
  _List_node_base *p_Var6;
  
  p_Var6 = (this->intervals).
           super__List_base<dg::dda::IntervalsList::Interval,_std::allocator<dg::dda::IntervalsList::Interval>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var6 != (_List_node_base *)this) {
    for (p_Var5 = (rhs->intervals).
                  super__List_base<dg::dda::IntervalsList::Interval,_std::allocator<dg::dda::IntervalsList::Interval>_>
                  ._M_impl._M_node.super__List_node_base._M_next; p_Var5 != (_List_node_base *)rhs;
        p_Var5 = (((list<dg::dda::IntervalsList::Interval,_std::allocator<dg::dda::IntervalsList::Interval>_>
                    *)&p_Var5->_M_next)->
                 super__List_base<dg::dda::IntervalsList::Interval,_std::allocator<dg::dda::IntervalsList::Interval>_>
                 )._M_impl._M_node.super__List_node_base._M_next) {
      while( true ) {
        p_Var3 = *(_List_node_base **)((long)(p_Var6 + 1) + 8);
        p_Var4 = *(_List_node_base **)
                  &((list<dg::dda::IntervalsList::Interval,_std::allocator<dg::dda::IntervalsList::Interval>_>
                     *)(p_Var5 + 1))->
                   super__List_base<dg::dda::IntervalsList::Interval,_std::allocator<dg::dda::IntervalsList::Interval>_>
        ;
        if (p_Var4 <= p_Var3) break;
        p_Var3 = (((list<dg::dda::IntervalsList::Interval,_std::allocator<dg::dda::IntervalsList::Interval>_>
                    *)&p_Var6->_M_next)->
                 super__List_base<dg::dda::IntervalsList::Interval,_std::allocator<dg::dda::IntervalsList::Interval>_>
                 )._M_impl._M_node.super__List_node_base._M_next;
        psVar1 = &(this->intervals).
                  super__List_base<dg::dda::IntervalsList::Interval,_std::allocator<dg::dda::IntervalsList::Interval>_>
                  ._M_impl._M_node._M_size;
        *psVar1 = *psVar1 - 1;
        std::__detail::_List_node_base::_M_unhook();
        operator_delete(p_Var6,0x20);
        p_Var6 = p_Var3;
        if (p_Var3 == (_List_node_base *)this) {
          return this;
        }
      }
      p_Var2 = p_Var6[1]._M_next;
      if (p_Var2 <= *(_List_node_base **)((long)(p_Var5 + 1) + 8)) {
        if (p_Var4 < p_Var2) {
          p_Var4 = p_Var2;
        }
        p_Var6[1]._M_next = p_Var4;
        if (*(_List_node_base **)((long)(p_Var5 + 1) + 8) < p_Var3) {
          p_Var3 = *(_List_node_base **)((long)(p_Var5 + 1) + 8);
        }
        *(_List_node_base **)((long)(p_Var6 + 1) + 8) = p_Var3;
      }
    }
  }
  return this;
}

Assistant:

IntervalsList &intersectWith(const IntervalsList &rhs) {
        if (intervals.empty())
            return *this;

        auto it = intervals.begin();
        for (const auto &RI : rhs.intervals) {
            while (it->end < RI.start) {
                auto tmp = it++;
                intervals.erase(tmp);
                if (it == intervals.end()) {
                    return *this;
                }
            }
            if (it->overlaps(RI)) {
                it->start = std::max(it->start, RI.start);
                it->end = std::min(it->end, RI.end);
            }
        }

        return *this;
    }